

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderInvarianceTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles3::Functional::anon_unknown_1::InvarianceTest::checkImage
          (InvarianceTest *this,Surface *surface)

{
  ostringstream *poVar1;
  void *pvVar2;
  TestLog *pTVar3;
  int iVar4;
  ulong __n;
  Surface *surface_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  bool bVar5;
  int iVar6;
  LogImageSet *this_00;
  allocator<char> local_366;
  allocator<char> local_365;
  allocator<char> local_364;
  allocator<char> local_363;
  allocator<char> local_362;
  allocator<char> local_361;
  string local_360;
  string local_340;
  undefined1 local_320 [32];
  Surface errorMask;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  IVec4 local_288;
  LogImageSet local_270;
  LogImage local_230;
  undefined1 local_1a0 [384];
  
  local_288.m_data[0] = 0;
  local_288.m_data[1] = 0xff;
  local_288.m_data[2] = 0;
  local_288.m_data[3] = 0xff;
  tcu::Surface::Surface(&errorMask,this->m_renderSize,this->m_renderSize);
  tcu::Surface::getAccess((PixelBufferAccess *)local_1a0,&errorMask);
  tcu::clear((PixelBufferAccess *)local_1a0,&local_288);
  __n = (ulong)(uint)this->m_renderSize;
  bVar5 = false;
  for (iVar4 = 0; iVar4 < (int)__n; iVar4 = iVar4 + 1) {
    pvVar2 = (surface->m_pixels).m_ptr;
    for (iVar6 = 0; iVar6 < (int)__n; iVar6 = iVar6 + 1) {
      if (*(char *)((long)pvVar2 + (long)(surface->m_width * iVar4 + iVar6) * 4) != '\0') {
        *(undefined4 *)
         ((long)errorMask.m_pixels.m_ptr + (long)(errorMask.m_width * iVar4 + iVar6) * 4) =
             0xff0000ff;
        __n = (ulong)(uint)this->m_renderSize;
        bVar5 = true;
      }
    }
  }
  if (bVar5) {
    local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Invalid pixels found (fragments from first render pass found). Variance detected."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_320,"Results",&local_366);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_340,"Result verification",&local_361);
    tcu::LogImageSet::LogImageSet(&local_270,(string *)local_320,&local_340);
    iVar4 = (int)pTVar3;
    tcu::LogImageSet::write(&local_270,iVar4,__buf,__n);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"Result",&local_362);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"Result",&local_363);
    tcu::LogImage::LogImage
              ((LogImage *)local_1a0,&local_360,&local_2a8,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1a0,iVar4,__buf_00,(size_t)surface);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"Error mask",&local_364)
    ;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"Error mask",&local_365)
    ;
    surface_00 = &errorMask;
    tcu::LogImage::LogImage
              (&local_230,&local_2c8,&local_2e8,surface_00,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_230,iVar4,__buf_01,(size_t)surface_00);
    tcu::TestLog::endImageSet(pTVar3);
    tcu::LogImage::~LogImage(&local_230);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_2c8);
    tcu::LogImage::~LogImage((LogImage *)local_1a0);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_360);
    tcu::LogImageSet::~LogImageSet(&local_270);
    std::__cxx11::string::~string((string *)&local_340);
    this_00 = (LogImageSet *)local_320;
  }
  else {
    local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"No variance found.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"Results",(allocator<char> *)&local_2a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_320,"Result verification",(allocator<char> *)&local_2c8);
    tcu::LogImageSet::LogImageSet((LogImageSet *)&local_230,&local_270.m_name,(string *)local_320);
    iVar4 = (int)pTVar3;
    tcu::LogImageSet::write((LogImageSet *)&local_230,iVar4,__buf_02,__n);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_340,"Result",(allocator<char> *)&local_2e8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"Result",&local_366);
    tcu::LogImage::LogImage
              ((LogImage *)local_1a0,&local_340,&local_360,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1a0,iVar4,__buf_03,(size_t)surface);
    tcu::TestLog::endImageSet(pTVar3);
    tcu::LogImage::~LogImage((LogImage *)local_1a0);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_340);
    tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_230);
    std::__cxx11::string::~string((string *)local_320);
    this_00 = &local_270;
  }
  std::__cxx11::string::~string((string *)this_00);
  tcu::Surface::~Surface(&errorMask);
  return (bool)(~bVar5 & 1);
}

Assistant:

bool InvarianceTest::checkImage (const tcu::Surface& surface) const
{
	const tcu::IVec4	okColor		= tcu::IVec4(0, 255, 0, 255);
	const tcu::RGBA		errColor	= tcu::RGBA(255, 0, 0, 255);
	bool				error		= false;
	tcu::Surface		errorMask	(m_renderSize, m_renderSize);

	tcu::clear(errorMask.getAccess(), okColor);

	for (int y = 0; y < m_renderSize; ++y)
	for (int x = 0; x < m_renderSize; ++x)
	{
		const tcu::RGBA col = surface.getPixel(x, y);

		if (col.getRed() != 0)
		{
			errorMask.setPixel(x, y, errColor);
			error = true;
		}
	}

	// report error
	if (error)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid pixels found (fragments from first render pass found). Variance detected." << tcu::TestLog::EndMessage;
		m_testCtx.getLog()
			<< tcu::TestLog::ImageSet("Results", "Result verification")
			<< tcu::TestLog::Image("Result",		"Result",		surface)
			<< tcu::TestLog::Image("Error mask",	"Error mask",	errorMask)
			<< tcu::TestLog::EndImageSet;

		return false;
	}
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "No variance found." << tcu::TestLog::EndMessage;
		m_testCtx.getLog()
			<< tcu::TestLog::ImageSet("Results", "Result verification")
			<< tcu::TestLog::Image("Result", "Result", surface)
			<< tcu::TestLog::EndImageSet;

		return true;
	}
}